

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::SimpleRockSample::PrintAction(SimpleRockSample *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  
  if ((uint)action < 4) {
    poVar1 = std::operator<<(out,&DAT_00109324 + *(int *)(&DAT_00109324 + (ulong)(uint)action * 4));
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void SimpleRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == A_SAMPLE)
		out << "Sample" << endl;
	if (action == A_CHECK)
		out << "Check" << endl;
	if (action == A_EAST)
		out << "EAST " << endl;
	if (action == A_WEST)
		out << "West" << endl;
}